

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_leaflist(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  int *first_00;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_ordering(out,node->flags,first_00);
  jsons_print_type_(out,(lys_type *)&node[1].ref,1,(int *)0x0);
  jsons_print_text(out,"units","name",(char *)node[1].next,1,(int *)0x0);
  jsons_print_defaults(out,&(node[1].prev)->name,node->padding[2],(int *)0x0);
  if (*(int *)&node[1].priv != 0) {
    ly_print(out,"%s\"min-elements\":{\"value\":%u}",",");
  }
  if (*(int *)((long)&node[1].priv + 4) != 0) {
    ly_print(out,"%s\"max-elements\":{\"value\":%u}",",");
  }
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,(lys_when *)node[1].name,(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[3],(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_leaflist(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_leaflist *llist = (struct lys_node_leaflist *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", llist->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", llist->ref, 1, NULL);
    jsons_print_status(out, llist->flags, NULL);
    jsons_print_config(out, llist->flags, NULL);
    jsons_print_ordering(out, llist->flags, NULL);
    jsons_print_type(out, &llist->type, NULL);
    jsons_print_text(out, "units", "name", llist->units, 1, NULL);
    jsons_print_defaults(out, llist->dflt, llist->dflt_size, NULL);
    if (llist->min) {
        jsons_print_min(out, llist->min, NULL);
    }
    if (llist->max) {
        jsons_print_max(out, llist->max, NULL);
    }
    jsons_print_iffeatures(out, llist->module, llist->iffeature, llist->iffeature_size, NULL);
    jsons_print_when(out, llist->when, NULL);
    jsons_print_musts(out, llist->must, llist->must_size, NULL);
    ly_print(out, "}");
}